

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O0

int xml_print_data(lyout *out,lyd_node *root,int options)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  uint local_6c;
  uint local_5c;
  uint local_44;
  int action_input;
  int level;
  lys_node *parent;
  lyd_node *next;
  lyd_node *node;
  lyd_node *plStack_20;
  int options_local;
  lyd_node *root_local;
  lyout *out_local;
  
  _action_input = (lys_node *)0x0;
  bVar5 = false;
  piVar2 = __errno_location();
  *piVar2 = 0;
  if (root == (lyd_node *)0x0) {
    if ((out->type == LYOUT_MEMORY) || (out->type == LYOUT_CALLBACK)) {
      ly_print(out,"");
    }
  }
  else {
    local_44 = (uint)((options & 2U) != 0);
    plStack_20 = root;
    if ((options & 0x100U) != 0) {
      next = root;
      if (root->schema->nodetype != LYS_RPC) {
        while ((next != (lyd_node *)0x0 && (next->schema->nodetype != LYS_ACTION))) {
          if ((next->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            parent = (lys_node *)next->child;
          }
          else {
            parent = (lys_node *)0x0;
          }
          if (parent == (lys_node *)0x0) {
            if (next == root) break;
            parent = (lys_node *)next->next;
          }
          while ((parent == (lys_node *)0x0 && (next = next->parent, next->parent != root->parent)))
          {
            parent = (lys_node *)next->next;
          }
          next = (lyd_node *)parent;
        }
      }
      if (next != (lyd_node *)0x0) {
        if (((next->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
             LYS_UNKNOWN) && (next->child != (lyd_node *)0x0)) {
          _action_input = lys_parent(next->child->schema);
          while( true ) {
            bVar4 = false;
            if (_action_input != (lys_node *)0x0) {
              bVar4 = _action_input->nodetype == LYS_USES;
            }
            if (!bVar4) break;
            _action_input = lys_parent(_action_input);
          }
        }
        if ((_action_input == (lys_node *)0x0) || (_action_input->nodetype != LYS_OUTPUT)) {
          bVar5 = next->schema->nodetype == LYS_ACTION;
        }
        else {
          plStack_20 = next->child;
        }
      }
    }
    if (bVar5) {
      if (local_44 == 0) {
        local_5c = 0;
      }
      else {
        local_5c = local_44 * 2 - 2;
      }
      pcVar3 = "";
      if (local_44 != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,"%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s",(ulong)local_5c,"",pcVar3
              );
      if (local_44 != 0) {
        local_44 = local_44 + 1;
      }
    }
    for (next = plStack_20; next != (lyd_node *)0x0; next = next->next) {
      iVar1 = xml_print_node(out,local_44,next,1,options);
      if (iVar1 != 0) {
        return 1;
      }
      if ((options & 1U) == 0) break;
    }
    if (bVar5) {
      if (local_44 != 0) {
        local_44 = local_44 - 1;
      }
      if (local_44 == 0) {
        local_6c = 0;
      }
      else {
        local_6c = local_44 * 2 - 2;
      }
      pcVar3 = "";
      if (local_44 != 0) {
        pcVar3 = "\n";
      }
      ly_print(out,"%*s</action>%s",(ulong)local_6c,"",pcVar3);
    }
  }
  ly_print_flush(out);
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar3);
  }
  out_local._4_4_ = (uint)(iVar1 != 0);
  return out_local._4_4_;
}

Assistant:

int
xml_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    const struct lyd_node *node, *next;
    struct lys_node *parent = NULL;
    int level, action_input = 0;

    LY_PRINT_SET;

    if (!root) {
        if (out->type == LYOUT_MEMORY || out->type == LYOUT_CALLBACK) {
            ly_print(out, "");
        }
        goto finish;
    }

    level = (options & LYP_FORMAT ? 1 : 0);

    if (options & LYP_NETCONF) {
        if (root->schema->nodetype != LYS_RPC) {
            /* learn whether we are printing an action */
            LY_TREE_DFS_BEGIN(root, next, node) {
                if (node->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(root, next, node);
            }
        } else {
            node = root;
        }

        if (node) {
            if ((node->schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_RPC | LYS_NOTIF | LYS_ACTION)) && node->child) {
                for (parent = lys_parent(node->child->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
            }
            if (parent && (parent->nodetype == LYS_OUTPUT)) {
                /* rpc/action output - skip the container */
                root = node->child;
            } else if (node->schema->nodetype == LYS_ACTION) {
                /* action input - print top-level action element */
                action_input = 1;
            }
        }
    }

    if (action_input) {
        ly_print(out, "%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s", LEVEL, INDENT, level ? "\n" : "");
        if (level) {
            ++level;
        }
    }

    /* content */
    LY_TREE_FOR(root, node) {
        if (xml_print_node(out, level, node, 1, options)) {
            return EXIT_FAILURE;
        }
        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    if (action_input) {
        if (level) {
            --level;
        }
        ly_print(out, "%*s</action>%s", LEVEL, INDENT, level ? "\n" : "");
    }

finish:
    ly_print_flush(out);

    LY_PRINT_RET(NULL);
}